

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O3

bool testFromStdString(String *str)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  
  __s1 = (str->view_)._M_str;
  if (__s1 == stdstr_abi_cxx11_._M_dataplus._M_p) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.data() != stdstr.data()) failed on line ",0x38
              );
    iVar2 = 0xa7;
  }
  else if ((str->view_)._M_len == 3) {
    iVar2 = strncmp(__s1,stdstr_abi_cxx11_._M_dataplus._M_p,3);
    if (iVar2 == 0) {
      bVar1 = cm::String::is_stable(str);
      if (bVar1) {
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str.is_stable()) failed on line ",0x2c);
      iVar2 = 0xab;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "ASSERT_TRUE(std::strncmp(str.data(), stdstr.data(), 3) == 0) failed on line ",0x4c
                );
      iVar2 = 0xaa;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ASSERT_TRUE(str.size() == 3) failed on line ",0x2c);
    iVar2 = 0xa9;
  }
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  return false;
}

Assistant:

static bool testFromStdString(cm::String const& str)
{
#if defined(_GLIBCXX_USE_CXX11_ABI) && _GLIBCXX_USE_CXX11_ABI
  // It would be nice to check this everywhere, but several platforms
  // still use a CoW implementation even in C++11.
  ASSERT_TRUE(str.data() != stdstr.data());
#endif
  ASSERT_TRUE(str.size() == 3);
  ASSERT_TRUE(std::strncmp(str.data(), stdstr.data(), 3) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}